

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O2

void __thiscall ktx::CommandCreate::executeCreate(CommandCreate *this)

{
  Reporter *report;
  optional<_khr_df_transfer_e> *this_00;
  undefined1 *opts;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined8 uVar4;
  char cVar5;
  ktx_error_code_e kVar6;
  int iVar7;
  int extraout_EAX;
  uint32_t uVar8;
  _khr_df_transfer_e *p_Var9;
  _khr_df_primaries_e *p_Var10;
  Origin *pOVar11;
  undefined4 extraout_var;
  float *pfVar12;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  char **ppcVar13;
  optional<unsigned_int> *poVar14;
  uint uVar15;
  CommandCreate *pCVar16;
  OutputStream *usedSourceOrigin_00;
  char *pcVar17;
  CommandCreate *pCVar18;
  uint32_t h;
  khr_df_transfer_e transfer_02;
  khr_df_transfer_e transfer_03;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  khr_df_transfer_e extraout_EDX;
  khr_df_transfer_e extraout_EDX_00;
  khr_df_transfer_e transfer;
  khr_df_primaries_e primaries;
  undefined8 *extraout_RDX_01;
  undefined8 *extraout_RDX_02;
  undefined8 *extraout_RDX_03;
  undefined8 *puVar19;
  pointer *__ptr;
  uint uVar20;
  string *psVar21;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  uint uVar22;
  _Alloc_hider __source;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double __x;
  string_view filepath;
  string_view filepath_00;
  string_view filepath_01;
  string_view filepath_02;
  string_view filepath_03;
  string_view fmt;
  string_view filepath_04;
  string_view fmt_00;
  string_view filepath_05;
  string_view fmt_01;
  string_view filepath_06;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  string_view fmt_07;
  string_view filepath_07;
  string_view filepath_08;
  string_view filepath_09;
  string_view filepath_10;
  string_view filepath_11;
  string_view filepath_12;
  string_view filepath_13;
  string_view fmt_08;
  string_view fmt_09;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  format_args args_09;
  ImageInput *local_338;
  Origin usedSourceOrigin;
  KTXTexture2 texture;
  undefined1 local_320 [16];
  string writer;
  MetricsCalculator metrics;
  uint32_t maxLevels;
  string writerScParams;
  OutputStream outputFile;
  uint32_t expectedImageHeight;
  uint32_t expectedImageWidth;
  pointer local_268;
  CommandCreate *local_260;
  ColorSpaceInfo local_258;
  undefined1 local_230 [24];
  path outputPath;
  ImageSpec target;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  bool local_f8 [8];
  undefined1 auStack_f0 [8];
  char *errorFmt;
  _Optional_payload_base<float> _Stack_e0;
  optional<ImageSpec::Origin> *local_d8;
  optional<_khr_df_primaries_e> *local_d0;
  undefined1 local_c8 [16];
  ImageSpec firstImageSpec;
  khr_df_transfer_e transfer_00;
  khr_df_transfer_e transfer_01;
  
  texture.handle_ = (ktxTexture2 *)0x0;
  this->targetChannelCount = (this->options).super_OptionsCreate.formatDesc.extended.channelCount;
  target.formatDesc.extended.iccProfile.name._M_dataplus._M_p =
       (pointer)&target.formatDesc.extended.iccProfile.name.field_2;
  target.formatDesc.basic._0_8_ = 0;
  target.formatDesc.basic._8_5_ = 0;
  target.formatDesc.basic._13_3_ = 0;
  target.formatDesc.extended.channelCount = 0;
  target.formatDesc.extended.sameUnitAllChannels = false;
  target.formatDesc.extended.oeGamma = -1.0;
  target.formatDesc.extended.iccProfile.name._M_string_length = 0;
  local_230._8_8_ = &(this->options).super_OptionsCreate.formatDesc;
  pCVar18 = (CommandCreate *)0x0;
  target.formatDesc.extended.iccProfile.name.field_2._M_local_buf[0] = '\0';
  target.formatDesc.extended.iccProfile.profile.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  target.formatDesc.extended.iccProfile.profile.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  target.formatDesc.extended.iccProfile.profile.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  target.formatDesc.samples.
  super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  target.formatDesc.samples.
  super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  target.formatDesc.samples.
  super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_7_ = 0;
  target.formatDesc.samples.
  super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  target.imageWidth = 0;
  target.imageHeight = 0;
  target.imageDepth = 0;
  target.imageOrigin.x = '\0';
  target.imageOrigin.y = '\0';
  target.imageOrigin.z = '\0';
  puVar19 = (undefined8 *)&local_258;
  local_258.dst.colorPrimaries._M_t.
  super___uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>._M_t.
  super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>.
  super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl =
       (__uniq_ptr_data<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>,_true,_true>
       )(__uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>)0x0;
  firstImageSpec.formatDesc.extended.iccProfile.name._M_dataplus._M_p =
       (pointer)&firstImageSpec.formatDesc.extended.iccProfile.name.field_2;
  firstImageSpec.formatDesc.basic._0_8_ = 0;
  firstImageSpec.formatDesc.basic._8_5_ = 0;
  firstImageSpec.formatDesc.basic._13_3_ = 0;
  firstImageSpec.formatDesc.extended.channelCount = 0;
  firstImageSpec.formatDesc.extended.sameUnitAllChannels = false;
  local_258.src.colorPrimaries._M_t.
  super___uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>._M_t.
  super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>.
  super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl =
       (__uniq_ptr_data<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>,_true,_true>
       )(__uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>)0x0;
  local_258.dst.transferFunction._M_t.
  super___uniq_ptr_impl<const_TransferFunction,_std::default_delete<const_TransferFunction>_>._M_t.
  super__Tuple_impl<0UL,_const_TransferFunction_*,_std::default_delete<const_TransferFunction>_>.
  super__Head_base<0UL,_const_TransferFunction_*,_false>._M_head_impl =
       (__uniq_ptr_data<const_TransferFunction,_std::default_delete<const_TransferFunction>,_true,_true>
        )(__uniq_ptr_impl<const_TransferFunction,_std::default_delete<const_TransferFunction>_>)0x0;
  local_258.src._0_8_ = (pointer)0x0;
  local_258.src.transferFunction._M_t.
  super___uniq_ptr_impl<const_TransferFunction,_std::default_delete<const_TransferFunction>_>._M_t.
  super__Tuple_impl<0UL,_const_TransferFunction_*,_std::default_delete<const_TransferFunction>_>.
  super__Head_base<0UL,_const_TransferFunction_*,_false>._M_head_impl =
       (__uniq_ptr_data<const_TransferFunction,_std::default_delete<const_TransferFunction>,_true,_true>
        )(__uniq_ptr_impl<const_TransferFunction,_std::default_delete<const_TransferFunction>_>)0x0;
  firstImageSpec.formatDesc.extended.oeGamma = -1.0;
  firstImageSpec.formatDesc.extended.iccProfile.name._M_string_length = 0;
  firstImageSpec.formatDesc.extended.iccProfile.name.field_2._M_local_buf[0] = '\0';
  firstImageSpec.formatDesc.extended.iccProfile.profile.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  firstImageSpec.formatDesc.extended.iccProfile.profile.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  firstImageSpec.formatDesc.extended.iccProfile.profile.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  firstImageSpec.formatDesc.samples.
  super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  firstImageSpec.formatDesc.samples.
  super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  firstImageSpec.formatDesc.samples.
  super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_7_ = 0;
  firstImageSpec.formatDesc.samples.
  super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  firstImageSpec.imageWidth = 0;
  firstImageSpec.imageHeight = 0;
  firstImageSpec.imageDepth = 0;
  firstImageSpec.imageOrigin.x = '\0';
  firstImageSpec.imageOrigin.y = '\0';
  firstImageSpec.imageOrigin.z = '\0';
  maxLevels = 1;
  __source._M_p =
       (pointer)(this->options).super_OptionsMultiInSingleOut.inputFilepaths.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_230._0_8_ = &(this->options).super_OptionsCreate.imageScale;
  report = &(this->super_Command).super_Reporter;
  this_00 = &(this->options).super_OptionsCreate.assignTF;
  local_d0 = &(this->options).super_OptionsCreate.assignPrimaries;
  local_d8 = &(this->options).super_OptionsCreate.assignTexcoordOrigin;
  bVar1 = true;
  do {
    uVar20 = 1;
    if ((this->options).super_OptionsCreate.mipmapGenerate == false) {
      uVar20 = this->numLevels;
    }
    if (uVar20 <= (uint)pCVar18) {
      if ((pointer)__source._M_p !=
          (this->options).super_OptionsMultiInSingleOut.inputFilepaths.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        __assert_fail("inputFileIt == options.inputFilepaths.end() && \"Internal error\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_create.cpp"
                      ,0x5b9,
                      "void ktx::CommandCreate::foreachImage(const FormatDescriptor &, F &&) [F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_create.cpp:1502:38)]"
                     );
      }
      version_abi_cxx11_(&outputFile.filepath,
                         (ktx *)(ulong)(this->options).super_OptionsGeneric.testrun,SUB81(puVar19,0)
                        );
      outputPath._M_pathname._M_dataplus._M_p =
           (this->super_Command).super_Reporter.commandName._M_dataplus._M_p;
      outputPath._M_pathname._M_string_length =
           (this->super_Command).super_Reporter.commandName._M_string_length;
      outputPath._M_pathname.field_2._M_allocated_capacity =
           (size_type)outputFile.filepath._M_dataplus._M_p;
      outputPath._M_pathname.field_2._8_8_ = outputFile.filepath._M_string_length;
      fmt_08.size_ = 0xdd;
      fmt_08.data_ = (char *)0x5;
      args_08.field_1.args_ = in_R9.args_;
      args_08.desc_ = (unsigned_long_long)&outputPath;
      ::fmt::v10::vformat_abi_cxx11_(&writer,(v10 *)0x1d8e91,fmt_08,args_08);
      std::__cxx11::string::~string((string *)&outputFile);
      ktxHashList_AddKVPair
                (&(texture.handle_)->kvDataHead,"KTXwriter",(int)writer._M_string_length + 1,
                 writer._M_dataplus._M_p);
      if ((this->options).super_OptionsCreate.swizzle.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged == true) {
        ktxHashList_AddKVPair
                  (&(texture.handle_)->kvDataHead,"KTXswizzle",
                   *(int *)((long)&(this->options).super_OptionsCreate.swizzle.
                                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                   ._M_payload.
                                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                   .
                                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ._M_payload + 8) + 1,
                   (this->options).super_OptionsCreate.swizzle.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload._M_value._M_dataplus._M_p);
      }
      metrics._0_8_ = metrics._0_8_ & 0xffffffff00000000;
      metrics.referenceImages.super__Vector_base<basisu::image,_std::allocator<basisu::image>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      metrics.referenceImages.super__Vector_base<basisu::image,_std::allocator<basisu::image>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      metrics.referenceImages.super__Vector_base<basisu::image,_std::allocator<basisu::image>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      opts = &(this->options).super_OptionsEncodeCommon.field_0x29;
      MetricsCalculator::saveReferenceImages(&metrics,&texture,(OptionsMetrics *)opts,report);
      if ((this->options).super_OptionsEncodeBasis<false>.codec != NONE) {
        encodeBasis(this,&texture,&(this->options).super_OptionsEncodeBasis<false>);
      }
      if ((this->options).super_OptionsEncodeASTC.encodeASTC == true) {
        encodeASTC(this,&texture,&(this->options).super_OptionsEncodeASTC);
      }
      MetricsCalculator::decodeAndCalculateMetrics(&metrics,&texture,(OptionsMetrics *)opts,report);
      compress(this,&texture,&(this->options).super_OptionsDeflate);
      outputPath._M_pathname._M_dataplus._M_p =
           (this->options).super_OptionsEncodeASTC.astcOptions._M_dataplus._M_p;
      outputPath._M_pathname._M_string_length =
           (this->options).super_OptionsEncodeASTC.astcOptions._M_string_length;
      outputPath._M_pathname.field_2._M_allocated_capacity =
           (size_type)(this->options).super_OptionsEncodeBasis<false>.codecOptions._M_dataplus._M_p;
      outputPath._M_pathname.field_2._8_8_ =
           (this->options).super_OptionsEncodeBasis<false>.codecOptions._M_string_length;
      outputPath._32_8_ = (this->options).super_OptionsEncodeCommon.commonOptions._M_dataplus._M_p;
      fmt_09.size_ = 0xdddd;
      fmt_09.data_ = (char *)0x8;
      args_09.field_1.args_ = in_R9.args_;
      args_09.desc_ = (unsigned_long_long)&outputPath;
      ::fmt::v10::vformat_abi_cxx11_(&writerScParams,(v10 *)0x1de5d1,fmt_09,args_09);
      if (writerScParams._M_string_length != 0) {
        if (*writerScParams._M_dataplus._M_p != ' ') {
          __assert_fail("writerScParams[0] == \' \'",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_create.cpp"
                        ,0x73e,"void ktx::CommandCreate::executeCreate()");
        }
        ktxHashList_AddKVPair
                  (&(texture.handle_)->kvDataHead,"KTXwriterScParams",
                   writerScParams._M_string_length,writerScParams._M_dataplus._M_p + 1);
      }
      psVar21 = &(this->options).super_OptionsMultiInSingleOut.outputFilepath;
      std::__cxx11::string::string((string *)local_108._M_local_buf,(string *)psVar21);
      outputFile.filepath._M_dataplus._M_p = (pointer)&outputFile.filepath.field_2;
      if ((bool *)local_108._M_allocated_capacity == local_f8) {
        outputFile.filepath.field_2._8_8_ = auStack_f0;
      }
      else {
        outputFile.filepath._M_dataplus._M_p = (pointer)local_108._M_allocated_capacity;
      }
      outputFile.filepath._M_string_length = local_108._8_8_;
      local_108._8_8_ = (pointer)0x0;
      local_f8[0] = false;
      local_108._M_allocated_capacity = (size_type)local_f8;
      std::filesystem::__cxx11::path::path(&outputPath,&outputFile.filepath,auto_format);
      std::__cxx11::string::~string((string *)&outputFile);
      std::__cxx11::string::~string((string *)local_108._M_local_buf);
      cVar5 = std::filesystem::__cxx11::path::has_parent_path();
      if (cVar5 != '\0') {
        std::filesystem::__cxx11::path::parent_path();
        std::filesystem::create_directories((path *)&outputFile);
        std::filesystem::__cxx11::path::~path((path *)&outputFile);
      }
      OutputStream::OutputStream(&outputFile,psVar21,report);
      OutputStream::writeKTX2(&outputFile,(ktxTexture *)texture.handle_,report);
      OutputStream::~OutputStream(&outputFile);
      std::filesystem::__cxx11::path::~path(&outputPath);
      std::__cxx11::string::~string((string *)&writerScParams);
      std::vector<basisu::image,_std::allocator<basisu::image>_>::~vector(&metrics.referenceImages);
      std::__cxx11::string::~string((string *)&writer);
      FormatDescriptor::~FormatDescriptor(&firstImageSpec.formatDesc);
      ColorSpaceInfo::~ColorSpaceInfo(&local_258);
      FormatDescriptor::~FormatDescriptor(&target.formatDesc);
      KTXTexture2::~KTXTexture2(&texture);
      return;
    }
    uVar20 = this->baseDepth >> ((byte)pCVar18 & 0x1f);
    pCVar16 = pCVar18;
    local_230._20_4_ =
         ceil_div<unsigned_int>(uVar20 + (uVar20 == 0),*(byte *)(local_230._8_8_ + 6) + 1);
    puVar19 = extraout_RDX;
    local_c8._8_8_ = pCVar18;
    for (uVar20 = 0; uVar20 < this->numLayers; uVar20 = uVar20 + 1) {
      for (local_268 = (pointer)0x0; (uint)local_268 < this->numFaces;
          local_268 = (pointer)(ulong)((int)local_268 + 1)) {
        for (local_260 = (CommandCreate *)0x0; local_230._20_4_ != (uint)local_260;
            local_260 = (CommandCreate *)(ulong)((int)local_260 + 1)) {
          if ((pointer)__source._M_p ==
              (this->options).super_OptionsMultiInSingleOut.inputFilepaths.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            __assert_fail("inputFileIt != options.inputFilepaths.end() && \"Internal error\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_create.cpp"
                          ,0x5b3,
                          "void ktx::CommandCreate::foreachImage(const FormatDescriptor &, F &&) [F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_create.cpp:1502:38)]"
                         );
          }
          local_320._12_4_ = SUB84(pCVar18,0);
          if ((this->options).super_OptionsCreate.raw == true) {
            if (bVar1) {
              uVar8 = 1;
              if ((this->options).super_OptionsCreate.width.
                  super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int>._M_engaged != false) {
                uVar8 = (this->options).super_OptionsCreate.width.
                        super__Optional_base<unsigned_int,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_int>._M_payload._M_value;
              }
              h = 1;
              if ((this->options).super_OptionsCreate.height.
                  super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int>._M_engaged != false) {
                h = (this->options).super_OptionsCreate.height.
                    super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int>._M_payload._M_value;
              }
              pCVar16 = (CommandCreate *)0x1;
              if ((this->options).super_OptionsCreate.depth.
                  super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int>._M_engaged != false) {
                pCVar16 = (CommandCreate *)
                          (ulong)(this->options).super_OptionsCreate.depth.
                                 super__Optional_base<unsigned_int,_true,_true>._M_payload.
                                 super__Optional_payload_base<unsigned_int>._M_payload._M_value;
              }
              ImageSpec::ImageSpec
                        ((ImageSpec *)&outputPath,uVar8,h,(uint32_t)pCVar16,
                         (FormatDescriptor *)local_230._8_8_);
              ImageSpec::operator=(&target,(ImageSpec *)&outputPath);
              FormatDescriptor::~FormatDescriptor((FormatDescriptor *)&outputPath);
              if (((this->options).super_OptionsCreate.cubemap == true) &&
                 (target.imageWidth != target.imageHeight)) {
                filepath._M_str = (char *)pCVar16;
                filepath._M_len = *(size_t *)__source._M_p;
                fmtInFile_abi_cxx11_((string *)&outputPath,*(ktx **)(__source._M_p + 8),filepath);
                outputFile.filepath._M_dataplus._M_p._0_4_ = target.imageWidth;
                writer._M_dataplus._M_p._0_4_ = target.imageHeight;
                pCVar16 = (CommandCreate *)&outputPath;
                Reporter::fatal<char_const(&)[76],std::__cxx11::string,unsigned_int,unsigned_int>
                          (report,INVALID_FILE,
                           (char (*) [76])
                           "--cubemap specified but the input image \"{}\" with size {}x{} is not square."
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &outputPath,(uint *)&outputFile,(uint *)&writer);
                std::__cxx11::string::~string((string *)&outputPath);
              }
              if ((this->options).super_OptionsCreate.assignTF.
                  super__Optional_base<_khr_df_transfer_e,_true,_true>._M_payload.
                  super__Optional_payload_base<_khr_df_transfer_e>._M_engaged == true) {
                p_Var9 = std::optional<_khr_df_transfer_e>::value(this_00);
                FormatDescriptor::setTransfer(&target.formatDesc,*p_Var9);
              }
              if ((this->options).super_OptionsCreate.assignPrimaries.
                  super__Optional_base<_khr_df_primaries_e,_true,_true>._M_payload.
                  super__Optional_payload_base<_khr_df_primaries_e>._M_engaged == true) {
                p_Var10 = std::optional<_khr_df_primaries_e>::value(local_d0);
                target.formatDesc.basic._1_1_ = (char)*p_Var10;
              }
              if ((this->options).super_OptionsCreate.assignTexcoordOrigin.
                  super__Optional_base<ImageSpec::Origin,_true,_true>._M_payload.
                  super__Optional_payload_base<ImageSpec::Origin>._M_engaged == true) {
                pOVar11 = std::optional<ImageSpec::Origin>::value(local_d8);
                target.imageOrigin.z = pOVar11->z;
                pCVar16 = (CommandCreate *)
                          CONCAT71((int7)((ulong)pCVar16 >> 8),target.imageOrigin.z);
                uVar2 = pOVar11->x;
                uVar3 = pOVar11->y;
                target.imageOrigin.x = uVar2;
                target.imageOrigin.y = uVar3;
              }
              createTexture((CommandCreate *)&outputPath,(ImageSpec *)this);
              texture.handle_ = (ktxTexture2 *)outputPath._M_pathname._M_dataplus._M_p;
              outputPath._M_pathname._M_dataplus._M_p = (pointer)0x0;
              KTXTexture2::~KTXTexture2((KTXTexture2 *)&outputPath);
            }
            std::filesystem::__cxx11::path::
            path<std::__cxx11::string,std::filesystem::__cxx11::path>
                      (&outputPath,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __source._M_p,auto_format);
            readRawFile(&outputFile.filepath,this,&outputPath);
            std::filesystem::__cxx11::path::~path(&outputPath);
            writer._M_dataplus._M_p =
                 (pointer)(*(texture.handle_)->vtbl->GetImageSize)
                                    ((ktxTexture *)texture.handle_,local_320._12_4_);
            in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                     )writer._M_dataplus._M_p;
            if ((pointer)outputFile.filepath._M_string_length != writer._M_dataplus._M_p) {
              filepath_00._M_str = (char *)pCVar16;
              filepath_00._M_len = *(size_t *)__source._M_p;
              fmtInFile_abi_cxx11_((string *)&outputPath,*(ktx **)(__source._M_p + 8),filepath_00);
              metrics._0_8_ = outputFile.filepath._M_string_length;
              Reporter::
              fatal<char_const(&)[93],std::__cxx11::string,unsigned_long,unsigned_int&,unsigned_long_const&>
                        (report,INVALID_FILE,
                         (char (*) [93])
                         "Raw input file \"{}\" with {} bytes for level {} does not match the expected size of {} bytes."
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &outputPath,(unsigned_long *)&metrics,(uint *)(local_320 + 0xc),
                         (unsigned_long *)&writer);
              std::__cxx11::string::~string((string *)&outputPath);
              in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                       )outputFile.filepath._M_string_length;
            }
            uVar15 = (int)local_268 + (int)local_260;
            pCVar16 = (CommandCreate *)(ulong)uVar15;
            kVar6 = (*(texture.handle_)->vtbl->SetImageFromMemory)
                              ((ktxTexture *)texture.handle_,local_320._12_4_,uVar20,uVar15,
                               (ktx_uint8_t *)outputFile.filepath._M_dataplus._M_p,(ktx_size_t)in_R9
                              );
            if (kVar6 != KTX_SUCCESS) {
              __assert_fail("ret == KTX_SUCCESS && \"Internal error\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_create.cpp"
                            ,0x60b,
                            "auto ktx::CommandCreate::executeCreate()::(anonymous class)::operator()(const auto &, uint32_t, uint32_t, uint32_t, uint32_t) const [inputFilepath:auto = std::basic_string<char>]"
                           );
            }
            std::__cxx11::string::~string((string *)&outputFile);
            puVar19 = extraout_RDX_00;
          }
          else {
            outputFile.filepath._M_string_length = 0;
            outputFile.filepath.field_2._8_8_ =
                 std::
                 _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_create.cpp:1490:28)>
                 ::_M_invoke;
            outputFile.filepath.field_2._M_allocated_capacity =
                 (size_type)
                 std::
                 _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_create.cpp:1490:28)>
                 ::_M_manager;
            usedSourceOrigin_00 = &outputFile;
            outputFile.filepath._M_dataplus._M_p = (pointer)this;
            ImageInput::open((char *)&local_338,(int)__source._M_p,0,&outputFile);
            std::_Function_base::~_Function_base((_Function_base *)&outputFile);
            (*local_338->_vptr_ImageInput[0x16])(local_338,0,0);
            usedSourceOrigin.x = '\0';
            usedSourceOrigin.y = '\0';
            usedSourceOrigin.z = '\0';
            if (bVar1) {
              if ((this->options).super_OptionsCreate.imageScale.
                  super__Optional_base<float,_true,_true>._M_payload.
                  super__Optional_payload_base<float>._M_engaged == true) {
                iVar7 = (*local_338->_vptr_ImageInput[0xe])();
                uVar15 = *(uint *)(CONCAT44(extraout_var,iVar7) + 0x70);
                pfVar12 = std::optional<float>::value((optional<float> *)local_230._0_8_);
                local_230._16_4_ = (float)uVar15 * *pfVar12;
                iVar7 = (*local_338->_vptr_ImageInput[0xe])();
                uVar22 = *(uint *)(CONCAT44(extraout_var_00,iVar7) + 0x74);
                pfVar12 = std::optional<float>::value((optional<float> *)local_230._0_8_);
                uVar15 = (uint)(long)(float)local_230._16_4_;
                uVar8 = (uint32_t)(long)((float)uVar22 * *pfVar12);
              }
              else {
                iVar7 = (*local_338->_vptr_ImageInput[0xe])();
                uVar15 = *(uint *)(CONCAT44(extraout_var_01,iVar7) + 0x70);
                bVar1 = (this->options).super_OptionsCreate.width.
                        super__Optional_base<unsigned_int,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_int>._M_engaged;
                uVar22 = (this->options).super_OptionsCreate.width.
                         super__Optional_base<unsigned_int,_true,_true>._M_payload.
                         super__Optional_payload_base<unsigned_int>._M_payload._M_value;
                iVar7 = (*local_338->_vptr_ImageInput[0xe])();
                if (bVar1 != false) {
                  uVar15 = uVar22;
                }
                poVar14 = &(this->options).super_OptionsCreate.height;
                if ((this->options).super_OptionsCreate.height.
                    super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int>._M_engaged == false) {
                  poVar14 = (optional<unsigned_int> *)(CONCAT44(extraout_var_02,iVar7) + 0x74);
                }
                uVar8 = (poVar14->super__Optional_base<unsigned_int,_true,_true>)._M_payload.
                        super__Optional_payload_base<unsigned_int>._M_payload._M_value;
              }
              pCVar18 = (CommandCreate *)0x1;
              if ((this->options).super_OptionsCreate.depth.
                  super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int>._M_engaged != false) {
                pCVar18 = (CommandCreate *)
                          (ulong)(this->options).super_OptionsCreate.depth.
                                 super__Optional_base<unsigned_int,_true,_true>._M_payload.
                                 super__Optional_payload_base<unsigned_int>._M_payload._M_value;
              }
              ImageSpec::ImageSpec
                        ((ImageSpec *)&outputPath,uVar15,uVar8,(uint32_t)pCVar18,
                         (FormatDescriptor *)local_230._8_8_);
              ImageSpec::operator=(&target,(ImageSpec *)&outputPath);
              FormatDescriptor::~FormatDescriptor((FormatDescriptor *)&outputPath);
              __x = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
              if (((this->options).super_OptionsCreate.cubemap == true) &&
                 (__x = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da),
                 target.imageWidth != target.imageHeight)) {
                filepath_01._M_str = (char *)pCVar18;
                filepath_01._M_len = *(size_t *)__source._M_p;
                fmtInFile_abi_cxx11_((string *)&outputPath,*(ktx **)(__source._M_p + 8),filepath_01)
                ;
                writer._M_dataplus._M_p._0_4_ = target.imageWidth;
                metrics.referenceNumChannels = target.imageHeight;
                in_R9.values_ =
                     (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&metrics;
                pCVar18 = (CommandCreate *)&outputPath;
                Reporter::fatal<char_const(&)[76],std::__cxx11::string,unsigned_int,unsigned_int>
                          (report,INVALID_FILE,
                           (char (*) [76])
                           "--cubemap specified but the input image \"{}\" with size {}x{} is not square."
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &outputPath,(uint *)&writer,(uint *)in_R9.values_);
                __x = (double)std::__cxx11::string::~string((string *)&outputPath);
              }
              filepath_02._M_str._1_7_ = (undefined7)((ulong)pCVar18 >> 8);
              filepath_02._M_str._0_1_ =
                   target.imageHeight != 1 & (this->options).super_OptionsCreate._1d;
              if ((byte)filepath_02._M_str == 1) {
                filepath_02._M_len = *(size_t *)__source._M_p;
                fmtInFile_abi_cxx11_((string *)&outputPath,*(ktx **)(__source._M_p + 8),filepath_02)
                ;
                writer._M_dataplus._M_p._0_4_ = target.imageHeight;
                Reporter::fatal<char_const(&)[76],std::__cxx11::string,unsigned_int>
                          (report,INVALID_FILE,
                           (char (*) [76])
                           "For --1d textures the input image height must be 1, but for \"{}\" it was {}."
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &outputPath,(uint *)&writer);
                __x = (double)std::__cxx11::string::~string((string *)&outputPath);
              }
              log2(__x);
              maxLevels = extraout_EAX + 1;
              pcVar17 = (char *)0x1;
              if ((this->options).super_OptionsCreate.levels.
                  super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int>._M_engaged != false) {
                pcVar17 = (char *)(ulong)(this->options).super_OptionsCreate.levels.
                                         super__Optional_base<unsigned_int,_true,_true>._M_payload.
                                         super__Optional_payload_base<unsigned_int>._M_payload.
                                         _M_value;
              }
              if (maxLevels < (uint)pcVar17) {
                writer._M_dataplus._M_p = (pointer)&writer.field_2;
                writer._M_string_length = 0;
                errorFmt = 
                "Requested {} levels is too many. With {} {}x{} and depth {} the texture can only have {} levels at most."
                ;
                writer.field_2._M_local_buf[0] = '\0';
                if (((this->options).super_OptionsCreate.width.
                     super__Optional_base<unsigned_int,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_int>._M_engaged == false) &&
                   ((this->options).super_OptionsCreate.height.
                    super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int>._M_engaged != true)) {
                  if ((this->options).super_OptionsCreate.imageScale.
                      super__Optional_base<float,_true,_true>._M_payload.
                      super__Optional_payload_base<float>._M_engaged == true) {
                    filepath_03._M_str = pcVar17;
                    filepath_03._M_len = *(size_t *)__source._M_p;
                    fmtInFile_abi_cxx11_(&writerScParams,*(ktx **)(__source._M_p + 8),filepath_03);
                    iVar7 = (*local_338->_vptr_ImageInput[0xe])();
                    uVar15 = *(uint *)(CONCAT44(extraout_var_03,iVar7) + 0x70);
                    iVar7 = (*local_338->_vptr_ImageInput[0xe])();
                    uVar22 = *(uint *)(CONCAT44(extraout_var_04,iVar7) + 0x74);
                    std::optional<float>::value((optional<float> *)local_230._0_8_);
                    outputPath._M_pathname._M_dataplus = writerScParams._M_dataplus;
                    outputPath._M_pathname._M_string_length = writerScParams._M_string_length;
                    fmt.size_ = 0x922d;
                    fmt.data_ = (char *)0x32;
                    args.field_1.args_ = in_R9.args_;
                    args.desc_ = (unsigned_long_long)&outputPath;
                    outputPath._M_pathname.field_2._M_allocated_capacity = (ulong)uVar15;
                    outputPath._32_8_ = (ulong)uVar22;
                    ::fmt::v10::vformat_abi_cxx11_
                              ((string *)&metrics,
                               (v10 *)"base input image \"{}\" sized {}x{} * scale {} being",fmt,
                               args);
                    std::__cxx11::string::operator=((string *)&writer,(string *)&metrics);
                    std::__cxx11::string::~string((string *)&metrics);
                    psVar21 = &writerScParams;
                  }
                  else {
                    filepath_04._M_str = pcVar17;
                    filepath_04._M_len = *(size_t *)__source._M_p;
                    fmtInFile_abi_cxx11_
                              ((string *)&metrics,*(ktx **)(__source._M_p + 8),filepath_04);
                    writerScParams._M_dataplus._M_p = (pointer)metrics._0_8_;
                    writerScParams._M_string_length =
                         (size_type)
                         metrics.referenceImages.
                         super__Vector_base<basisu::image,_std::allocator<basisu::image>_>._M_impl.
                         super__Vector_impl_data._M_start;
                    fmt_00.size_ = 0xd;
                    fmt_00.data_ = (char *)0x1b;
                    args_00.field_1.args_ = in_R9.args_;
                    args_00.desc_ = (unsigned_long_long)&writerScParams;
                    ::fmt::v10::vformat_abi_cxx11_
                              ((string *)&outputPath,(v10 *)"base input image \"{}\" sized",fmt_00,
                               args_00);
                    std::__cxx11::string::operator=((string *)&writer,(string *)&outputPath);
                    std::__cxx11::string::~string((string *)&outputPath);
                    psVar21 = (string *)&metrics;
                  }
                  std::__cxx11::string::~string((string *)psVar21);
                }
                else {
                  std::__cxx11::string::assign((char *)&writer);
                }
                uVar15 = 1;
                if ((this->options).super_OptionsCreate.levels.
                    super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int>._M_engaged != false) {
                  uVar15 = (this->options).super_OptionsCreate.levels.
                           super__Optional_base<unsigned_int,_true,_true>._M_payload.
                           super__Optional_payload_base<unsigned_int>._M_payload._M_value;
                }
                outputPath._M_pathname._M_dataplus._M_p._0_4_ = uVar15;
                metrics.referenceNumChannels = target.imageWidth;
                writerScParams._M_dataplus._M_p._0_4_ = target.imageHeight;
                in_R9.values_ =
                     (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
                     &writerScParams;
                Reporter::
                fatal_usage<char_const*&,unsigned_int,std::__cxx11::string&,unsigned_int,unsigned_int,unsigned_int&,unsigned_int&>
                          (report,&errorFmt,(uint *)&outputPath,&writer,
                           &metrics.referenceNumChannels,(uint *)in_R9.values_,&this->baseDepth,
                           &maxLevels);
                std::__cxx11::string::~string((string *)&writer);
              }
              checkNumInputImages(this);
              if ((this->options).super_OptionsEncodeASTC.encodeASTC == true) {
                iVar7 = (*local_338->_vptr_ImageInput[0xe])();
                uVar8 = FormatDescriptor::largestChannelBitLength
                                  ((FormatDescriptor *)CONCAT44(extraout_var_05,iVar7));
                selectASTCMode(this,uVar8);
              }
              iVar7 = (*local_338->_vptr_ImageInput[0xe])();
              ImageSpec::operator=(&firstImageSpec,(ImageSpec *)CONCAT44(extraout_var_06,iVar7));
              determineTargetColorSpace(this,local_338,&target,&local_258);
              usedSourceOrigin_00 = (OutputStream *)&usedSourceOrigin;
              determineTargetOrigin(this,local_338,&target,(Origin *)usedSourceOrigin_00);
              createTexture((CommandCreate *)&outputPath,(ImageSpec *)this);
              texture.handle_ = (ktxTexture2 *)outputPath._M_pathname._M_dataplus._M_p;
              outputPath._M_pathname._M_dataplus._M_p = (pointer)0x0;
              KTXTexture2::~KTXTexture2((KTXTexture2 *)&outputPath);
            }
            else {
              checkSpecsMatch(this,local_338,&firstImageSpec);
              determineSourceColorSpace(this,local_338,&local_258.src);
              determineSourceOrigin(this,local_338,&usedSourceOrigin);
            }
            pcVar17 = (char *)CONCAT71((int7)((ulong)usedSourceOrigin_00 >> 8),local_320[0xc]);
            uVar15 = firstImageSpec.imageWidth >> (local_320[0xc] & 0x1f);
            expectedImageWidth = uVar15 + (uVar15 == 0);
            uVar15 = firstImageSpec.imageHeight >> (local_320[0xc] & 0x1f);
            expectedImageHeight = uVar15 + (uVar15 == 0);
            uVar15 = target.imageWidth >> (local_320[0xc] & 0x1f);
            uVar15 = uVar15 + (uVar15 == 0);
            uVar22 = target.imageHeight >> (local_320[0xc] & 0x1f);
            iVar7 = (*local_338->_vptr_ImageInput[0xe])();
            if ((*(uint32_t *)(CONCAT44(extraout_var_07,iVar7) + 0x70) != expectedImageWidth) ||
               (iVar7 = (*local_338->_vptr_ImageInput[0xe])(),
               *(uint32_t *)(CONCAT44(extraout_var_08,iVar7) + 0x74) != expectedImageHeight)) {
              writer._M_dataplus._M_p =
                   "Input image \"{}\" with size {}x{} does not match expected size {}x{} for level {}."
              ;
              filepath_05._M_str = pcVar17;
              filepath_05._M_len = *(size_t *)__source._M_p;
              fmtInFile_abi_cxx11_((string *)&outputPath,*(ktx **)(__source._M_p + 8),filepath_05);
              iVar7 = (*local_338->_vptr_ImageInput[0xe])();
              metrics.referenceNumChannels = *(uint32_t *)(CONCAT44(extraout_var_09,iVar7) + 0x70);
              iVar7 = (*local_338->_vptr_ImageInput[0xe])();
              writerScParams._M_dataplus._M_p._0_4_ =
                   *(undefined4 *)(CONCAT44(extraout_var_10,iVar7) + 0x74);
              in_R9.values_ =
                   (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
                   &writerScParams;
              Reporter::
              fatal<char_const*const&,std::__cxx11::string,unsigned_int,unsigned_int,unsigned_int_const&,unsigned_int_const&,unsigned_int&>
                        (report,INVALID_FILE,(char **)&writer,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &outputPath,&metrics.referenceNumChannels,(uint *)in_R9.values_,
                         &expectedImageWidth,&expectedImageHeight,(uint *)(local_320 + 0xc));
              std::__cxx11::string::~string((string *)&outputPath);
            }
            loadInputImage((CommandCreate *)local_320,(ImageInput *)this);
            if ((((uint)target.formatDesc.basic._0_4_ >> 0x10 & KHR_DF_TRANSFER_MAX) !=
                 local_258.src.usedTransferFunction) ||
               (pCVar16 = (CommandCreate *)(ulong)local_258.src.usedPrimaries,
               ((uint)target.formatDesc.basic._0_4_ >> 8 & KHR_DF_PRIMARIES_MAX) !=
               local_258.src.usedPrimaries)) {
              pCVar18 = (CommandCreate *)(ulong)local_258.src.usedPrimaries;
              if (((target.formatDesc.basic._0_8_ & 0xff00) != 0) &&
                 (local_258.src.usedPrimaries == KHR_DF_PRIMARIES_UNSPECIFIED)) {
                __assert_fail("(target.format().primaries() == colorSpaceInfo.src.usedPrimaries || colorSpaceInfo.src.usedPrimaries != KHR_DF_PRIMARIES_UNSPECIFIED) && \"determineSourceColorSpace failed to check for UNSPECIFIED.\""
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_create.cpp"
                              ,0x66c,
                              "auto ktx::CommandCreate::executeCreate()::(anonymous class)::operator()(const auto &, uint32_t, uint32_t, uint32_t, uint32_t) const [inputFilepath:auto = std::basic_string<char>]"
                             );
              }
              if ((_Tuple_impl<0UL,_const_TransferFunction_*,_std::default_delete<const_TransferFunction>_>
                   )local_258.src.transferFunction._M_t.
                    super___uniq_ptr_impl<const_TransferFunction,_std::default_delete<const_TransferFunction>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_const_TransferFunction_*,_std::default_delete<const_TransferFunction>_>
                    .super__Head_base<0UL,_const_TransferFunction_*,_false>._M_head_impl ==
                  (TransferFunction *)0x0) {
                writer._M_dataplus._M_p = (pointer)&writer.field_2;
                writer._M_string_length = 0;
                writer.field_2._M_local_buf[0] = '\0';
                local_c8._0_8_ = __source._M_p;
                if ((this->options).super_OptionsCreate.assignTF.
                    super__Optional_base<_khr_df_transfer_e,_true,_true>._M_payload.
                    super__Optional_payload_base<_khr_df_transfer_e>._M_engaged == true) {
                  metrics._0_8_ = OptionsCreate::kAssignTf;
                  fmt_01.size_ = 0xc;
                  fmt_01.data_ = (char *)0x13;
                  args_01.field_1.values_ = in_R9.values_;
                  args_01.desc_ = (unsigned_long_long)&metrics;
                  ::fmt::v10::vformat_abi_cxx11_
                            ((string *)&outputPath,(v10 *)"specified with --{}",fmt_01,args_01);
                  std::__cxx11::string::operator=((string *)&writer,(string *)&outputPath);
                  std::__cxx11::string::~string((string *)&outputPath);
                  transfer = extraout_EDX;
                }
                else {
                  filepath_06._M_str._0_4_ = local_258.src.usedPrimaries;
                  filepath_06._M_len = *(undefined8 *)__source._M_p;
                  filepath_06._M_str._4_4_ = 0;
                  fmtInFile_abi_cxx11_((string *)&metrics,*(ktx **)(__source._M_p + 8),filepath_06);
                  writerScParams._M_dataplus._M_p = (pointer)metrics._0_8_;
                  writerScParams._M_string_length =
                       (size_type)
                       metrics.referenceImages.
                       super__Vector_base<basisu::image,_std::allocator<basisu::image>_>._M_impl.
                       super__Vector_impl_data._M_start;
                  fmt_02.size_ = 0xd;
                  fmt_02.data_ = (char *)0x17;
                  args_02.field_1.values_ = in_R9.values_;
                  args_02.desc_ = (unsigned_long_long)&writerScParams;
                  ::fmt::v10::vformat_abi_cxx11_
                            ((string *)&outputPath,(v10 *)"used by input file \"{}\"",fmt_02,args_02
                            );
                  std::__cxx11::string::operator=((string *)&writer,(string *)&outputPath);
                  std::__cxx11::string::~string((string *)&outputPath);
                  std::__cxx11::string::~string((string *)&metrics);
                  transfer = extraout_EDX_00;
                }
                toString_abi_cxx11_(&writerScParams,(ktx *)(local_258.src._0_8_ & 0xffffffff),
                                    transfer);
                outputPath._M_pathname._M_dataplus._M_p = "decode from";
                outputPath._M_pathname.field_2._M_allocated_capacity =
                     (size_type)writerScParams._M_dataplus._M_p;
                outputPath._M_pathname.field_2._8_8_ = writerScParams._M_string_length;
                outputPath._32_8_ = writer._M_dataplus._M_p;
                fmt_03.size_ = 0xddc;
                fmt_03.data_ = (char *)0x34;
                pCVar18 = (CommandCreate *)0xddc;
                args_03.field_1.values_ = in_R9.values_;
                args_03.desc_ = (unsigned_long_long)&outputPath;
                ::fmt::v10::vformat_abi_cxx11_
                          ((string *)&metrics,
                           (v10 *)"Colorspace conversion requires unsupported {} {} {}.",fmt_03,
                           args_03);
                std::__cxx11::string::~string((string *)&writerScParams);
                __source._M_p = (pointer)local_c8._0_8_;
                if ((this->options).super_OptionsCreate.assignTF.
                    super__Optional_base<_khr_df_transfer_e,_true,_true>._M_payload.
                    super__Optional_payload_base<_khr_df_transfer_e>._M_engaged == false) {
                  outputPath._M_pathname._M_dataplus._M_p = OptionsCreate::kAssignTf;
                  outputPath._M_pathname.field_2._M_allocated_capacity =
                       (size_type)OptionsCreate::kConvertTf;
                  fmt_04.size_ = 0xcc;
                  fmt_04.data_ = (char *)0x63;
                  pCVar18 = (CommandCreate *)0xcc;
                  args_04.field_1.values_ = in_R9.values_;
                  args_04.desc_ = (unsigned_long_long)&outputPath;
                  ::fmt::v10::vformat_abi_cxx11_
                            (&writerScParams,
                             (v10 *)
                             " Use an image processing tool to convert it or use --{}, with or without --{}, to specify handling."
                             ,fmt_04,args_04);
                  std::__cxx11::string::append((string *)&metrics);
                  std::__cxx11::string::~string((string *)&writerScParams);
                }
                Reporter::fatal<std::__cxx11::string&>
                          (report,NOT_SUPPORTED,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &metrics);
                std::__cxx11::string::~string((string *)&metrics);
                std::__cxx11::string::~string((string *)&writer);
              }
              if (local_258.dst.transferFunction._M_t.
                  super___uniq_ptr_impl<const_TransferFunction,_std::default_delete<const_TransferFunction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_const_TransferFunction_*,_std::default_delete<const_TransferFunction>_>
                  .super__Head_base<0UL,_const_TransferFunction_*,_false>._M_head_impl ==
                  (__uniq_ptr_impl<const_TransferFunction,_std::default_delete<const_TransferFunction>_>
                   )0x0) {
                ppcVar13 = &OptionsCreate::kAssignTf;
                if ((this->options).super_OptionsCreate.convertTF.
                    super__Optional_base<_khr_df_transfer_e,_true,_true>._M_payload.
                    super__Optional_payload_base<_khr_df_transfer_e>._M_engaged != false) {
                  ppcVar13 = &OptionsCreate::kConvertTf;
                }
                outputPath._M_pathname._M_dataplus._M_p = *ppcVar13;
                fmt_05.size_ = 0xc;
                fmt_05.data_ = (char *)0x13;
                args_05.field_1.values_ = in_R9.values_;
                args_05.desc_ = (unsigned_long_long)&outputPath;
                ::fmt::v10::vformat_abi_cxx11_(&writer,(v10 *)"specified with --{}",fmt_05,args_05);
                toString_abi_cxx11_(&writerScParams,
                                    (ktx *)((ulong)target.formatDesc.basic._0_8_ >> 0x10 & 0xff),
                                    transfer_00);
                outputPath._M_pathname._M_dataplus._M_p = "encode to";
                outputPath._M_pathname.field_2._M_allocated_capacity =
                     (size_type)writerScParams._M_dataplus._M_p;
                outputPath._M_pathname.field_2._8_8_ = writerScParams._M_string_length;
                outputPath._32_8_ = writer._M_dataplus._M_p;
                fmt_06.size_ = 0xddc;
                fmt_06.data_ = (char *)0x34;
                pCVar18 = (CommandCreate *)0xddc;
                args_06.field_1.values_ = in_R9.values_;
                args_06.desc_ = (unsigned_long_long)&outputPath;
                ::fmt::v10::vformat_abi_cxx11_
                          ((string *)&metrics,
                           (v10 *)"Colorspace conversion requires unsupported {} {} {}.",fmt_06,
                           args_06);
                std::__cxx11::string::~string((string *)&writerScParams);
                if ((byte)target.formatDesc.basic._1_1_ != local_258.src.usedPrimaries) {
                  toString_abi_cxx11_(&writerScParams,
                                      (ktx *)(ulong)(byte)target.formatDesc.basic._1_1_,primaries);
                  errorFmt = writerScParams._M_dataplus._M_p;
                  _Stack_e0._M_payload =
                       (_Storage<float,_true>)(undefined4)writerScParams._M_string_length;
                  _Stack_e0._M_engaged = (bool)writerScParams._M_string_length._4_1_;
                  _Stack_e0._5_3_ = writerScParams._M_string_length._5_3_;
                  pCVar18 = (CommandCreate *)0xd;
                  fmt_07.size_ = 0xd;
                  fmt_07.data_ = (char *)0x51;
                  args_07.field_1.values_ = in_R9.values_;
                  args_07.desc_ = (unsigned_long_long)&errorFmt;
                  ::fmt::v10::vformat_abi_cxx11_
                            ((string *)&outputPath,
                             (v10 *)
                             " Decode and encode with transfer function is required to convert primaries to {}."
                             ,fmt_07,args_07);
                  std::__cxx11::string::append((string *)&metrics);
                  std::__cxx11::string::~string((string *)&outputPath);
                  std::__cxx11::string::~string((string *)&writerScParams);
                }
                Reporter::fatal<std::__cxx11::string&>
                          (report,NOT_SUPPORTED,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &metrics);
                std::__cxx11::string::~string((string *)&metrics);
                std::__cxx11::string::~string((string *)&writer);
              }
              if ((this->options).super_OptionsCreate.noWarnOnColorConversions == false) {
                pCVar18 = (CommandCreate *)0xff00ff;
                if ((((target.formatDesc.basic._0_4_ & 0xff00ff) == 0x10001) &&
                    (uVar8 = FormatDescriptor::channelBitLength(&target.formatDesc), uVar8 < 0xe))
                   && ((local_258.src.usedTransferFunction & ~KHR_DF_TRANSFER_LINEAR) ==
                       KHR_DF_TRANSFER_SCRGB)) {
                  filepath_07._M_str = (char *)pCVar18;
                  filepath_07._M_len = *(size_t *)__source._M_p;
                  fmtInFile_abi_cxx11_
                            ((string *)&outputPath,*(ktx **)(__source._M_p + 8),filepath_07);
                  toString_abi_cxx11_(&writer,(ktx *)(local_258.src._0_8_ & 0xffffffff),transfer_01)
                  ;
                  pCVar18 = (CommandCreate *)&writer;
                  Reporter::
                  warning<char_const(&)[156],std::__cxx11::string,std::__cxx11::string,char_const*&>
                            (report,(char (*) [156])
                                    "Input file \"{}\" is undergoing a visual lossy color conversion from {} to KHR_DF_TRANSFER_LINEAR. Specify an _SRGB format with --{} to prevent this warning."
                             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &outputPath,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &writer,&OptionsCreate::kFormat);
                  std::__cxx11::string::~string((string *)&writer);
                  std::__cxx11::string::~string((string *)&outputPath);
                }
              }
              if ((byte)target.formatDesc.basic._1_1_ == local_258.src.usedPrimaries) {
                if ((this->options).super_OptionsCreate.failOnColorConversions == true) {
                  filepath_08._M_str = (char *)pCVar18;
                  filepath_08._M_len = *(size_t *)__source._M_p;
                  fmtInFile_abi_cxx11_
                            ((string *)&outputPath,*(ktx **)(__source._M_p + 8),filepath_08);
                  pCVar18 = (CommandCreate *)&outputPath;
                  Reporter::fatal<char_const(&)[179],std::__cxx11::string>
                            (report,INVALID_FILE,
                             (char (*) [179])
                             "Input file \"{}\" would need color conversion as input and output transfer functions are different. Use --assign-tf and do not use --convert-tf to avoid unwanted color conversions."
                             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &outputPath);
                  std::__cxx11::string::~string((string *)&outputPath);
                }
                if ((this->options).super_OptionsCreate.warnOnColorConversions == true) {
                  filepath_09._M_str = (char *)pCVar18;
                  filepath_09._M_len = *(size_t *)__source._M_p;
                  fmtInFile_abi_cxx11_
                            ((string *)&outputPath,*(ktx **)(__source._M_p + 8),filepath_09);
                  Reporter::warning<char_const(&)[170],std::__cxx11::string>
                            (report,(char (*) [170])
                                    "Input file \"{}\" is color converted as input and output transfer functions are different. Use --assign-tf and do not use --convert-tf to avoid unwanted color conversions."
                             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &outputPath);
                  std::__cxx11::string::~string((string *)&outputPath);
                }
                pCVar16 = (CommandCreate *)0x0;
                (**(code **)(*(_func_int **)local_320._0_8_ + 0x98))
                          (local_320._0_8_,
                           local_258.src.transferFunction._M_t.
                           super___uniq_ptr_impl<const_TransferFunction,_std::default_delete<const_TransferFunction>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_const_TransferFunction_*,_std::default_delete<const_TransferFunction>_>
                           .super__Head_base<0UL,_const_TransferFunction_*,_false>._M_head_impl,
                           local_258.dst.transferFunction._M_t.
                           super___uniq_ptr_impl<const_TransferFunction,_std::default_delete<const_TransferFunction>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_const_TransferFunction_*,_std::default_delete<const_TransferFunction>_>
                           .super__Head_base<0UL,_const_TransferFunction_*,_false>._M_head_impl);
              }
              else {
                ColorPrimaries::transformTo
                          ((ColorPrimaryTransform *)&outputPath,
                           (ColorPrimaries *)
                           local_258.src.colorPrimaries._M_t.
                           super___uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>
                           .super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl,
                           (ColorPrimaries *)
                           local_258.dst.colorPrimaries._M_t.
                           super___uniq_ptr_impl<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_const_ColorPrimaries_*,_std::default_delete<const_ColorPrimaries>_>
                           .super__Head_base<0UL,_const_ColorPrimaries_*,_false>._M_head_impl);
                if ((this->options).super_OptionsCreate.failOnColorConversions == true) {
                  filepath_10._M_str = (char *)pCVar18;
                  filepath_10._M_len = *(size_t *)__source._M_p;
                  fmtInFile_abi_cxx11_(&writer,*(ktx **)(__source._M_p + 8),filepath_10);
                  pCVar18 = (CommandCreate *)&writer;
                  Reporter::fatal<char_const(&)[184],std::__cxx11::string>
                            (report,INVALID_FILE,
                             (char (*) [184])
                             "Input file \"{}\" would need color conversion as input and output primaries are different. Use --assign-primaries and do not use --convert-primaries to avoid unwanted color conversions."
                             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &writer);
                  std::__cxx11::string::~string((string *)&writer);
                }
                if ((this->options).super_OptionsCreate.warnOnColorConversions == true) {
                  filepath_11._M_str = (char *)pCVar18;
                  filepath_11._M_len = *(size_t *)__source._M_p;
                  fmtInFile_abi_cxx11_(&writer,*(ktx **)(__source._M_p + 8),filepath_11);
                  Reporter::warning<char_const(&)[175],std::__cxx11::string>
                            (report,(char (*) [175])
                                    "Input file \"{}\" is color converted as input and output primaries are different. Use --assign-primaries and do not use --convert-primaries to avoid unwanted color conversions."
                             ,&writer);
                  std::__cxx11::string::~string((string *)&writer);
                }
                pCVar16 = (CommandCreate *)&outputPath;
                (**(code **)(*(_func_int **)local_320._0_8_ + 0x98))
                          (local_320._0_8_,
                           local_258.src.transferFunction._M_t.
                           super___uniq_ptr_impl<const_TransferFunction,_std::default_delete<const_TransferFunction>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_const_TransferFunction_*,_std::default_delete<const_TransferFunction>_>
                           .super__Head_base<0UL,_const_TransferFunction_*,_false>._M_head_impl,
                           local_258.dst.transferFunction._M_t.
                           super___uniq_ptr_impl<const_TransferFunction,_std::default_delete<const_TransferFunction>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_const_TransferFunction_*,_std::default_delete<const_TransferFunction>_>
                           .super__Head_base<0UL,_const_TransferFunction_*,_false>._M_head_impl);
              }
            }
            if ((*(uint32_t *)(local_320._0_8_ + 8) != uVar15) ||
               (*(uint32_t *)(local_320._0_8_ + 0xc) != uVar22 + (uVar22 == 0))) {
              writer._M_dataplus._M_p = (pointer)local_320._0_8_;
              local_320._0_8_ = (__uniq_ptr_impl<Image,_std::default_delete<Image>_>)0x0;
              pCVar16 = (CommandCreate *)(ulong)uVar15;
              scaleImage((CommandCreate *)&outputPath,
                         (unique_ptr<Image,_std::default_delete<Image>_> *)this,
                         (ktx_uint32_t)&writer,uVar15);
              uVar4 = local_320._0_8_;
              local_320._0_8_ = outputPath._M_pathname._M_dataplus._M_p;
              if ((tuple<Image_*,_std::default_delete<Image>_>)uVar4 !=
                  (_Head_base<0UL,_Image_*,_false>)0x0) {
                (**(code **)(*(_func_int **)uVar4 + 8))();
              }
              if (writer._M_dataplus._M_p != (pointer)0x0) {
                (**(code **)(*(long *)writer._M_dataplus._M_p + 8))();
              }
              writer._M_dataplus._M_p = (pointer)0x0;
            }
            pCVar18 = (CommandCreate *)local_c8._8_8_;
            if (((target.imageOrigin.x != usedSourceOrigin.x) ||
                (target.imageOrigin.y != usedSourceOrigin.y)) ||
               (target.imageOrigin.z != usedSourceOrigin.z)) {
              if ((this->options).super_OptionsCreate.failOnOriginChanges == true) {
                filepath_12._M_str = (char *)pCVar16;
                filepath_12._M_len =
                     (size_t)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __source._M_p)->_M_dataplus)._M_p;
                fmtInFile_abi_cxx11_
                          ((string *)&outputPath,
                           (ktx *)((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)__source._M_p)->_M_string_length,filepath_12);
                pCVar16 = (CommandCreate *)&outputPath;
                Reporter::fatal<char_const(&)[153],std::__cxx11::string,char_const*&,char_const*&>
                          (report,INVALID_FILE,
                           (char (*) [153])
                           "Input file \"{}\" would need to be y-flipped as input and output origins are different. Use --{} and do not use --{} to avoid unwanted origin conversions."
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &outputPath,&OptionsCreate::kAssignTexcoordOrigin,
                           &OptionsCreate::kConvertTexcoordOrigin);
                std::__cxx11::string::~string((string *)&outputPath);
              }
              if ((this->options).super_OptionsCreate.warnOnOriginChanges == true) {
                filepath_13._M_str = (char *)pCVar16;
                filepath_13._M_len =
                     (size_t)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __source._M_p)->_M_dataplus)._M_p;
                fmtInFile_abi_cxx11_
                          ((string *)&outputPath,
                           (ktx *)((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)__source._M_p)->_M_string_length,filepath_13);
                Reporter::warning<char_const(&)[139],std::__cxx11::string,char_const*&,char_const*&>
                          (report,(char (*) [139])
                                  "Input file \"{}\" is y-flipped as input and output origins are different. Use --{} and do not use --{} to avoid unwanted origin conversions."
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &outputPath,&OptionsCreate::kAssignTexcoordOrigin,
                           &OptionsCreate::kConvertTexcoordOrigin);
                std::__cxx11::string::~string((string *)&outputPath);
              }
              (*(*(_func_int ***)local_320._0_8_)[0x12])();
            }
            if ((this->options).super_OptionsCreate.normalize == true) {
              if ((target.formatDesc.basic._0_8_ & 0xfe0000) != 0) {
                metrics._0_8_ = anon_var_dwarf_1b69b0;
                if ((this->options).super_OptionsCreate.convertTF.
                    super__Optional_base<_khr_df_transfer_e,_true,_true>._M_payload.
                    super__Optional_payload_base<_khr_df_transfer_e>._M_engaged == true) {
                  p_Var9 = std::optional<_khr_df_transfer_e>::value
                                     (&(this->options).super_OptionsCreate.convertTF);
                  toString_abi_cxx11_(&outputPath._M_pathname,(ktx *)(ulong)*p_Var9,transfer_02);
                  Reporter::fatal_usage<char_const*const&,char_const*&,std::__cxx11::string>
                            (report,(char **)&metrics,&OptionsCreate::kConvertTf,
                             &outputPath._M_pathname);
                }
                else {
                  if ((this->options).super_OptionsCreate.assignTF.
                      super__Optional_base<_khr_df_transfer_e,_true,_true>._M_payload.
                      super__Optional_payload_base<_khr_df_transfer_e>._M_engaged != true)
                  goto LAB_001493f4;
                  p_Var9 = std::optional<_khr_df_transfer_e>::value(this_00);
                  toString_abi_cxx11_(&outputPath._M_pathname,(ktx *)(ulong)*p_Var9,transfer_03);
                  Reporter::fatal_usage<char_const*const&,char_const*&,std::__cxx11::string>
                            (report,(char **)&metrics,&OptionsCreate::kAssignTf,
                             &outputPath._M_pathname);
                }
                std::__cxx11::string::~string((string *)&outputPath);
LAB_001493f4:
                __assert_fail("false && \"target.format().transfer() is not suitable for --normalize though --assign-tf and --conver-tf were not used.\""
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_create.cpp"
                              ,0x705,
                              "auto ktx::CommandCreate::executeCreate()::(anonymous class)::operator()(const auto &, uint32_t, uint32_t, uint32_t, uint32_t) const [inputFilepath:auto = std::basic_string<char>]"
                             );
              }
              (*(*(_func_int ***)local_320._0_8_)[0x14])();
            }
            if ((this->options).super_OptionsCreate.swizzleInput.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_engaged == true) {
              (**(code **)(*(_func_int **)local_320._0_8_ + 0xa8))
                        (local_320._0_8_,
                         (this->options).super_OptionsCreate.swizzleInput.
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ._M_payload._M_value._M_string_length,
                         (this->options).super_OptionsCreate.swizzleInput.
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ._M_payload._M_value._M_dataplus._M_p);
            }
            convert((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&outputPath,this,
                    (unique_ptr<Image,_std::default_delete<Image>_> *)local_320,
                    (this->options).super_OptionsCreate.vkFormat,local_338);
            uVar15 = (int)local_268 + (int)local_260;
            pCVar16 = (CommandCreate *)(ulong)uVar15;
            in_R9.values_ =
                 (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
                 (outputPath._M_pathname._M_string_length -
                 (long)outputPath._M_pathname._M_dataplus._M_p);
            kVar6 = (*(texture.handle_)->vtbl->SetImageFromMemory)
                              ((ktxTexture *)texture.handle_,local_320._12_4_,uVar20,uVar15,
                               (ktx_uint8_t *)outputPath._M_pathname._M_dataplus._M_p,
                               (ktx_size_t)in_R9);
            if (kVar6 != KTX_SUCCESS) {
              __assert_fail("ret == KTX_SUCCESS && \"Internal error\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_create.cpp"
                            ,0x716,
                            "auto ktx::CommandCreate::executeCreate()::(anonymous class)::operator()(const auto &, uint32_t, uint32_t, uint32_t, uint32_t) const [inputFilepath:auto = std::basic_string<char>]"
                           );
            }
            if ((this->options).super_OptionsCreate.mipmapGenerate == true) {
              poVar14 = &(this->options).super_OptionsCreate.levels;
              if ((this->options).super_OptionsCreate.levels.
                  super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int>._M_engaged == false) {
                poVar14 = (optional<unsigned_int> *)&maxLevels;
              }
              metrics._0_8_ = local_320._0_8_;
              local_320._0_8_ = (Image *)0x0;
              in_R9._4_4_ = 0;
              in_R9._0_4_ = uVar20;
              pCVar16 = local_260;
              generateMipLevels(this,&texture,
                                (unique_ptr<Image,_std::default_delete<Image>_> *)&metrics,local_338
                                ,(poVar14->super__Optional_base<unsigned_int,_true,_true>).
                                 _M_payload.super__Optional_payload_base<unsigned_int>._M_payload.
                                 _M_value,uVar20,(uint32_t)local_268,(uint32_t)local_260);
              if (metrics._0_8_ != 0) {
                (**(code **)(*(long *)metrics._0_8_ + 8))();
              }
              metrics.referenceNumChannels = 0;
              metrics._4_4_ = 0;
            }
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&outputPath);
            puVar19 = extraout_RDX_01;
            if ((Image *)local_320._0_8_ != (Image *)0x0) {
              (*(*(_func_int ***)local_320._0_8_)[1])();
              puVar19 = extraout_RDX_02;
            }
            if (local_338 != (ImageInput *)0x0) {
              (*local_338->_vptr_ImageInput[1])();
              puVar19 = extraout_RDX_03;
            }
          }
          __source._M_p = __source._M_p + 0x20;
          bVar1 = false;
        }
      }
    }
    pCVar18 = (CommandCreate *)(ulong)((int)pCVar18 + 1);
  } while( true );
}

Assistant:

void CommandCreate::executeCreate() {
    const auto warningFn = [this](const std::string& w) { this->warning(w); };

    KTXTexture2 texture{nullptr};
    targetChannelCount = options.formatDesc.channelCount();

    ImageSpec target;
    ColorSpaceInfo colorSpaceInfo{};

    bool firstImage = true;
    ImageSpec firstImageSpec{};
    uint32_t maxLevels = 1;

    foreachImage(options.formatDesc, [&](
            const auto& inputFilepath,
            uint32_t levelIndex,
            uint32_t layerIndex,
            uint32_t faceIndex,
            uint32_t depthSliceIndex) {

        if (options.raw) {
            if (std::exchange(firstImage, false)) {
                target = ImageSpec{
                        options.width.value_or(1u),
                        options.height.value_or(1u),
                        options.depth.value_or(1u),
                        options.formatDesc};

                if (options.cubemap && target.width() != target.height())
                    fatal(rc::INVALID_FILE, "--cubemap specified but the input image \"{}\" with size {}x{} is not square.",
                            fmtInFile(inputFilepath), target.width(), target.height());

                if (options.assignTF.has_value())
                    target.format().setTransfer(options.assignTF.value());

                if (options.assignPrimaries.has_value())
                    target.format().setPrimaries(options.assignPrimaries.value());

                if (options.assignTexcoordOrigin.has_value())
                    target.setOrigin(options.assignTexcoordOrigin.value());

                texture = createTexture(target);
            }

            const auto rawData = readRawFile(inputFilepath);

            const auto expectedFileSize = ktxTexture_GetImageSize(texture, levelIndex);
            if (rawData.size() != expectedFileSize)
                fatal(rc::INVALID_FILE, "Raw input file \"{}\" with {} bytes for level {} does not match the expected size of {} bytes.",
                        fmtInFile(inputFilepath), rawData.size(), levelIndex, expectedFileSize);

            const auto ret = ktxTexture_SetImageFromMemory(
                    texture,
                    levelIndex,
                    layerIndex,
                    faceIndex + depthSliceIndex, // Faces and Depths are mutually exclusive, Addition is acceptable
                    reinterpret_cast<const ktx_uint8_t*>(rawData.data()),
                    rawData.size());
            assert(ret == KTX_SUCCESS && "Internal error"); (void) ret;
        } else {
            const auto inputImageFile = ImageInput::open(inputFilepath, nullptr, warningFn);
            inputImageFile->seekSubimage(0, 0); // Loading multiple subimage from the same input is not supported

            ImageSpec::Origin usedSourceOrigin;

            if (std::exchange(firstImage, false)) {
                uint32_t targetWidth, targetHeight;
                if (options.imageScale.has_value()) {
                    targetWidth = static_cast<uint32_t>(inputImageFile->spec().width()
                                                        * options.imageScale.value());
                    targetHeight = static_cast<uint32_t>(inputImageFile->spec().height()
                                                         * options.imageScale.value());
                    // TODO: scale depth
                } else {
                    targetWidth = options.width.value_or(inputImageFile->spec().width());
                    targetHeight = options.height.value_or(inputImageFile->spec().height());
                    // TODO: handle resampling depth
                }

                target = ImageSpec{
                    targetWidth,
                    targetHeight,
                    options.depth.value_or(1u),
                    options.formatDesc};

               if (options.cubemap && target.width() != target.height())
                    fatal(rc::INVALID_FILE, "--cubemap specified but the input image \"{}\" with size {}x{} is not square.",
                            fmtInFile(inputFilepath), target.width(), target.height());

                if (options._1d && target.height() != 1)
                    fatal(rc::INVALID_FILE, "For --1d textures the input image height must be 1, but for \"{}\" it was {}.",
                            fmtInFile(inputFilepath), target.height());

                const auto maxDimension = std::max(target.width(), std::max(target.height(), baseDepth));
                maxLevels = log2(maxDimension) + 1;
                if (options.levels.value_or(1) > maxLevels) {
                    auto errorFmt = "Requested {} levels is too many. With {} {}x{} and depth {} the texture can only have {} levels at most.";
                    std::string baseExpl;
                    if (options.width.has_value() || options.height.has_value()) {
                        baseExpl = "a requested base image size of";
                    } else if (options.imageScale.has_value()) {
                        baseExpl = fmt::format(
                                           "base input image \"{}\" sized {}x{} * scale {} being",
                                           fmtInFile(inputFilepath), inputImageFile->spec().width(),
                                           inputImageFile->spec().height(),
                                           options.imageScale.value());
                    } else {
                        baseExpl = fmt::format("base input image \"{}\" sized", fmtInFile(inputFilepath));
                    }
                    fatal_usage(errorFmt, options.levels.value_or(1),
                                baseExpl,
                                target.width(), target.height(),
                                baseDepth, maxLevels);
                }

                checkNumInputImages();

                if (options.encodeASTC)
                    selectASTCMode(inputImageFile->spec().format().largestChannelBitLength());

                firstImageSpec = inputImageFile->spec();

                determineTargetColorSpace(*inputImageFile, target, colorSpaceInfo);
                determineTargetOrigin(*inputImageFile, target, usedSourceOrigin);
      
                texture = createTexture(target);
            } else {
                checkSpecsMatch(*inputImageFile, firstImageSpec);
                determineSourceColorSpace(*inputImageFile, colorSpaceInfo.src);
                determineSourceOrigin(*inputImageFile, usedSourceOrigin);
            }

            const uint32_t expectedImageWidth = std::max(firstImageSpec.width() >> levelIndex, 1u);
            const uint32_t expectedImageHeight = std::max(firstImageSpec.height() >> levelIndex, 1u);
            const uint32_t targetImageWidth = std::max(target.width() >> levelIndex, 1u);
            const uint32_t targetImageHeight = std::max(target.height() >> levelIndex, 1u);

            if (inputImageFile->spec().width() != expectedImageWidth || inputImageFile->spec().height() != expectedImageHeight) {
                const auto errorFmt = "Input image \"{}\" with size {}x{} does not match expected size {}x{} for level {}.";
                fatal(rc::INVALID_FILE, errorFmt, fmtInFile(inputFilepath),
                      inputImageFile->spec().width(),
                      inputImageFile->spec().height(),
                      // When no scaling option is specified image* == targetImage*.
                      expectedImageWidth, expectedImageHeight,
                      levelIndex);
            }
            auto image = loadInputImage(*inputImageFile);

            // Need to do color conversion if either the transfer functions or primaries don't
            // match. Primaries conversion requires decode to linear then reencode thus
            // transferFunctions are always required.
            if (target.format().transfer() != colorSpaceInfo.src.usedTransferFunction ||
                target.format().primaries() != colorSpaceInfo.src.usedPrimaries) {
                assert((target.format().primaries() == colorSpaceInfo.src.usedPrimaries
                       || colorSpaceInfo.src.usedPrimaries != KHR_DF_PRIMARIES_UNSPECIFIED)
                       && "determineSourceColorSpace failed to check for UNSPECIFIED.");
                const auto errorFmt = "Colorspace conversion requires unsupported {} {} {}.";
                if (colorSpaceInfo.src.transferFunction == nullptr) {
                    std::string source;
                    if (options.assignTF.has_value()) {
                        source = fmt::format("specified with --{}", options.kAssignTf);
                    } else {
                        source = fmt::format("used by input file \"{}\"", fmtInFile(inputFilepath));
                    }
                    auto errorMsg = fmt::format(errorFmt,
                                                "decode from",
                                                toString(colorSpaceInfo.src.usedTransferFunction),
                                                source);
                    if (!options.assignTF.has_value()) {
                        errorMsg += fmt::format(" Use an image processing tool to convert it or use"
                                                " --{}, with or without --{}, to specify handling.",
                                                options.kAssignTf, options.kConvertTf);
                    }
                    fatal(rc::NOT_SUPPORTED, errorMsg);
                }
                if (colorSpaceInfo.dst.transferFunction == nullptr) {
                    // If we get here it is because (a) a transfer supported for decode but not
                    // encode has been set with --assign-tf and (b) a primary conversion was
                    // requested with --convert-primaries. CLI checks prevent an unsupported
                    // transfer being given to --convert-tf.
                    auto source = fmt::format("specified with --{}", options.convertTF.has_value()
                                              ? options.kConvertTf : options.kAssignTf);
                    auto errorMsg = fmt::format(errorFmt,
                                                "encode to",
                                                toString(target.format().transfer()),
                                                source);
                    // Transfer functions derived from --format values are supported.
                    if (target.format().primaries() != colorSpaceInfo.src.usedPrimaries) {
                        errorMsg += fmt::format(" Decode and encode with transfer function is"
                                                " required to convert primaries to {}.",
                                                toString(target.format().primaries()));
                    }
                    fatal(rc::NOT_SUPPORTED, errorMsg);
                }
                if (!options.noWarnOnColorConversions) {
                    if (target.format().model() == KHR_DF_MODEL_RGBSDA
                        && target.format().transfer() == KHR_DF_TRANSFER_LINEAR) {
                        uint32_t bitLength;
                        try {
                            bitLength = target.format().channelBitLength();
                        } catch(...) {
                            // This happens if channels have different bit length. Check just R.
                            // If format is something like RGB565, any channel length would fail
                            // the bitLength test so picking R doesn't matter.
                            bitLength = target.format().channelBitLength(KHR_DF_CHANNEL_RGBSDA_R);
                        }

                        if (bitLength < 14) {
                            // Per Poynton, >= 14 bits is enough to handle all transitions
                            // visible to a human
                            if (colorSpaceInfo.src.usedTransferFunction == KHR_DF_TRANSFER_SRGB
                               || colorSpaceInfo.src.usedTransferFunction == KHR_DF_TRANSFER_ITU) {
                              warning("Input file \"{}\" is undergoing a visual lossy color conversion from {} "
                                      "to KHR_DF_TRANSFER_LINEAR. Specify an _SRGB format with --{} to prevent "
                                      "this warning.",
                                      fmtInFile(inputFilepath),
                                      toString(colorSpaceInfo.src.usedTransferFunction),
                                      options.kFormat);
                            }
                        }
                    }
                }
                if (target.format().primaries() != colorSpaceInfo.src.usedPrimaries) {
                //if (colorSpaceInfo.dst.colorPrimaries != nullptr) {
                    //assert(colorSpaceInfo.src.colorPrimaries != nullptr);
                    auto primaryTransform = colorSpaceInfo.src.colorPrimaries->transformTo(*colorSpaceInfo.dst.colorPrimaries);

                    if (options.failOnColorConversions)
                        fatal(rc::INVALID_FILE,
                            "Input file \"{}\" would need color conversion as input and output primaries are different. "
                            "Use --assign-primaries and do not use --convert-primaries to avoid unwanted color conversions.",
                            fmtInFile(inputFilepath));

                    if (options.warnOnColorConversions)
                        warning("Input file \"{}\" is color converted as input and output primaries are different. "
                            "Use --assign-primaries and do not use --convert-primaries to avoid unwanted color conversions.",
                            fmtInFile(inputFilepath));

                    // Transform transfer function with primary transform
                    image->transformColorSpace(*colorSpaceInfo.src.transferFunction, *colorSpaceInfo.dst.transferFunction, &primaryTransform);
                } else {
                    if (options.failOnColorConversions)
                        fatal(rc::INVALID_FILE,
                            "Input file \"{}\" would need color conversion as input and output transfer functions are different. "
                            "Use --assign-tf and do not use --convert-tf to avoid unwanted color conversions.",
                            fmtInFile(inputFilepath));

                    if (options.warnOnColorConversions)
                        warning("Input file \"{}\" is color converted as input and output transfer functions are different. "
                            "Use --assign-tf and do not use --convert-tf to avoid unwanted color conversions.",
                            fmtInFile(inputFilepath));

                    // Transform transfer function without primary transform
                    image->transformColorSpace(*colorSpaceInfo.src.transferFunction, *colorSpaceInfo.dst.transferFunction);
                }
            }

            // TODO: Add auto conversion and warning? Not needed now
            // because all supported source formats provide top-left images.

            if (image->getWidth() != targetImageWidth || image->getHeight() != targetImageHeight)
                image = scaleImage(std::move(image), targetImageWidth, targetImageHeight);

            if (target.origin() != usedSourceOrigin) {
                    if (options.failOnOriginChanges)
                        fatal(rc::INVALID_FILE,
                            "Input file \"{}\" would need to be y-flipped as input and output origins are different. "
                            "Use --{} and do not use --{} to avoid unwanted origin conversions.",
                            fmtInFile(inputFilepath), OptionsCreate::kAssignTexcoordOrigin,
                            OptionsCreate::kConvertTexcoordOrigin);

                    if (options.warnOnOriginChanges)
                        warning("Input file \"{}\" is y-flipped as input and output origins are different. "
                            "Use --{} and do not use --{} to avoid unwanted origin conversions.",
                            fmtInFile(inputFilepath), OptionsCreate::kAssignTexcoordOrigin,
                            OptionsCreate::kConvertTexcoordOrigin);

                // Only difference allowed by CLI is y down or y up.
                image->yflip();
            }

            if (options.normalize) {
                if (target.format().transfer() != KHR_DF_TRANSFER_UNSPECIFIED && target.format().transfer() != KHR_DF_TRANSFER_LINEAR) {
                    // Report source of problematic TF.
                    //
                    // If --format is an SRGB format
                    // - a fatal usage error will already have been thrown so nothing to do.
                    // If --format is non-SRGB format
                    // - absent TF options, an implicit conversion to LINEAR takes place if the file
                    //   TF is not LINEAR or UNSPECIFIED. If it can't be converted a fatal
                    //   unsupported conversion error will already have been thrown. Therefore
                    //   nothing to do. But if `create` is changed to set the TF for non-SRGB
                    //   formats from the file's TF then this error handling will need updating.
                    // - --assign-tf has many other possible values so that is a possible source.
                    // - --convert-tf can only be linear or srgb. If it's srgb and the format does
                    //   not have an equivalent SRGB format, that is another possible source.

                    //const auto input_error_message = "Input file \"{}\" The transfer function to be applied to the created texture is neither linear nor none. Normalize is only available for these transfer functions.";
                    //const auto inputTransfer =  inputImageFile->spec().format().transfer();
                    //bool is_file_error = (inputTransfer != KHR_DF_TRANSFER_UNSPECIFIED && inputTransfer != KHR_DF_TRANSFER_LINEAR);
                    const auto option_error_message = "--{} value is {}. Normalize can only be used if the transfer function is linear or none.";
                    if (options.convertTF.has_value()) {
                        fatal_usage(option_error_message, OptionsCreate::kConvertTf,
                                    toString(options.convertTF.value()));
                    } else if (options.assignTF.has_value()) {
                        fatal_usage(option_error_message, OptionsCreate::kAssignTf,
                                    toString(options.assignTF.value()));
                    }
                    assert(false && "target.format().transfer() is not suitable for --normalize though --assign-tf and --conver-tf were not used.");
                }
                image->normalize();
            }

            if (options.swizzleInput)
                image->swizzle(*options.swizzleInput);

            const auto imageData = convert(image, options.vkFormat, *inputImageFile);

            const auto ret = ktxTexture_SetImageFromMemory(
                    texture,
                    levelIndex,
                    layerIndex,
                    faceIndex + depthSliceIndex, // Faces and Depths are mutually exclusive, Addition is acceptable
                    imageData.data(),
                    imageData.size());
            assert(ret == KTX_SUCCESS && "Internal error"); (void) ret;

            if (options.mipmapGenerate) {
                uint32_t numMipLevels = options.levels.value_or(maxLevels);
                generateMipLevels(texture, std::move(image), *inputImageFile, numMipLevels, layerIndex, faceIndex, depthSliceIndex);
            }
        }
    });

    // Add KTXwriter metadata
    const auto writer = fmt::format("{} {}", commandName, version(options.testrun));
    ktxHashList_AddKVPair(&texture->kvDataHead, KTX_WRITER_KEY,
            static_cast<uint32_t>(writer.size() + 1), // +1 to include the \0
            writer.c_str());

    // Add KTXswizzle metadata
    if (options.swizzle) {
        ktxHashList_AddKVPair(&texture->kvDataHead, KTX_SWIZZLE_KEY,
                static_cast<uint32_t>(options.swizzle->size() + 1), // +1 to include the \0
                options.swizzle->c_str());
    }

    // Encode and apply compression

    MetricsCalculator metrics;
    metrics.saveReferenceImages(texture, options, *this);

    if (options.codec != BasisCodec::NONE)
        encodeBasis(texture, options);
    if (options.encodeASTC)
        encodeASTC(texture, options);

    metrics.decodeAndCalculateMetrics(texture, options, *this);

    compress(texture, options);

    // Add KTXwriterScParams metadata if ASTC encoding, BasisU encoding, or other supercompression was used
    const auto writerScParams = fmt::format("{}{}{}{}", options.astcOptions, options.codecOptions, options.commonOptions, options.compressOptions);
    if (writerScParams.size() > 0) {
        // Options always contain a leading space
        assert(writerScParams[0] == ' ');
        ktxHashList_AddKVPair(&texture->kvDataHead, KTX_WRITER_SCPARAMS_KEY,
            static_cast<uint32_t>(writerScParams.size()),
            writerScParams.c_str() + 1); // +1 to exclude leading space
    }

    // Save output file
    const auto outputPath = std::filesystem::path(DecodeUTF8Path(options.outputFilepath));
    if (outputPath.has_parent_path())
        std::filesystem::create_directories(outputPath.parent_path());

    OutputStream outputFile(options.outputFilepath, *this);
    outputFile.writeKTX2(texture, *this);
}